

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

GLuint deqp::gls::MultiTextureSamplerTest::createTexture2D(Functions *gl,int id)

{
  GLuint GVar1;
  GLenum GVar2;
  GLuint texture;
  Vec4 local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  Texture2D refTexture;
  
  texture = 0xffffffff;
  local_88.m_data[0] = 1.12104e-44;
  local_88.m_data[1] = 4.2039e-45;
  tcu::Texture2D::Texture2D(&refTexture,(TextureFormat *)&local_88,0x20,0x20);
  tcu::Texture2D::allocLevel(&refTexture,0);
  (*gl->genTextures)(1,&texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x374);
  if (id == 0) {
    local_88.m_data[0] = 0.0;
    local_88.m_data[1] = 0.0;
    local_88.m_data[2] = 0.0;
    local_88.m_data[3] = 0.0;
    local_78 = (undefined1 *)0x3f8000003f800000;
    puStack_70 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_88,(Vec4 *)&local_78);
  }
  else if (id == 1) {
    local_88.m_data[0] = 0.0;
    local_88.m_data[1] = 0.0;
    local_88.m_data[2] = 0.0;
    local_88.m_data[3] = 0.0;
    local_78 = &DAT_3f0000003f000000;
    puStack_70 = (undefined1 *)0x3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_88,(Vec4 *)&local_78);
  }
  (*gl->bindTexture)(0xde1,texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture(GL_TEXTURE_2D, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x385);
  (*gl->texImage2D)(0xde1,0,0x8058,refTexture.m_width,refTexture.m_height,0,0x1908,0x1401,
                    ((refTexture.super_TextureLevelPyramid.m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                    m_data);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,
                  "glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x388);
  (*gl->generateMipmap)(0xde1);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenerateMipmap(GL_TEXTURE_2D)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x38b);
  (*gl->bindTexture)(0xde1,0);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture(GL_TEXTURE_2D, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x38e);
  GVar1 = texture;
  tcu::Texture3D::~Texture3D((Texture3D *)&refTexture);
  return GVar1;
}

Assistant:

GLuint MultiTextureSamplerTest::createTexture2D (const glw::Functions& gl, int id)
{
	GLuint			texture		= (GLuint)-1;
	tcu::Texture2D	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEXTURE2D_WIDTH, TEXTURE2D_HEIGHT);

	refTexture.allocLevel(0);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures(1, &texture)");

	switch (id)
	{
		case 0:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 0.5f, 0.5f));
			break;

		case 1:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f));
			break;

		default:
			DE_ASSERT(false);
	}

	gl.bindTexture(GL_TEXTURE_2D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_2D, texture)");

	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())");

	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_2D)");

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_2D, 0)");

	return texture;
}